

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

vector<common_sampler_type,_std::allocator<common_sampler_type>_> *
common_sampler_types_from_names
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *names,bool allow_alt_names)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  __l_00;
  bool bVar1;
  byte in_DL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<common_sampler_type,_std::allocator<common_sampler_type>_> *in_RDI;
  iterator sampler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  sampler_alt_name_map;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  sampler_canonical_name_map;
  vector<common_sampler_type,_std::allocator<common_sampler_type>_> *samplers;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  *this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_true>
  in_stack_fffffffffffffb28;
  hasher *in_stack_fffffffffffffb30;
  size_type in_stack_fffffffffffffb38;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  *in_stack_fffffffffffffb40;
  iterator in_stack_fffffffffffffb48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb60;
  undefined1 **local_468;
  undefined1 **local_448;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_true>
  local_428;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_true>
  local_420;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_true>
  local_418;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_true>
  local_410;
  reference local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3f0;
  undefined1 local_3e8;
  undefined1 local_3e7 [47];
  undefined1 *local_3b8 [5];
  undefined1 local_390 [40];
  undefined1 local_368 [40];
  undefined1 local_340 [40];
  undefined1 local_318 [40];
  undefined1 local_2f0 [40];
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined8 *local_250;
  undefined8 local_248;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1d4;
  undefined8 *local_1d0;
  undefined1 *local_1c8 [5];
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined8 *local_60;
  undefined8 local_58;
  byte local_11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_11 = in_DL & 1;
  local_1d0 = local_1c8;
  local_1d4 = 1;
  local_10 = in_RSI;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[4],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [4])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_1a0;
  local_1e8 = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_178;
  local_1ec = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_150;
  local_1f0 = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_128;
  local_1f4 = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_100;
  local_1f8 = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[12],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [12])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_d8;
  local_1fc = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[4],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [4])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_b0;
  local_200 = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[7],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [7])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_1d0 = (undefined8 *)local_88;
  local_204 = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[10],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [10])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_60 = local_1c8;
  local_58 = 9;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
               *)0x36a20f);
  __l._M_len = (size_type)in_stack_fffffffffffffb50;
  __l._M_array = in_stack_fffffffffffffb48;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  ::unordered_map(in_stack_fffffffffffffb40,__l,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                  (key_equal *)in_stack_fffffffffffffb28._M_cur,in_stack_fffffffffffffb60);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
                *)0x36a25d);
  local_448 = (undefined1 **)&local_60;
  do {
    local_448 = local_448 + -5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
             *)0x36a294);
  } while (local_448 != local_1c8);
  local_3e7._39_8_ = local_3b8;
  local_3e7._35_4_ = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_390;
  local_3e7._31_4_ = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_368;
  local_3e7._27_4_ = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[8],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [8])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_340;
  local_3e7._23_4_ = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[10],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [10])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_318;
  local_3e7._19_4_ = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[8],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [8])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_2f0;
  local_3e7._15_4_ = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_2c8;
  local_3e7._11_4_ = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[4],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [4])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_2a0;
  local_3e7._7_4_ = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[6],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_3e7._39_8_ = local_278;
  local_3e7._3_4_ = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
  ::pair<const_char_(&)[5],_common_sampler_type,_true>
            (in_stack_fffffffffffffb50,(char (*) [5])in_stack_fffffffffffffb48,
             (common_sampler_type *)in_stack_fffffffffffffb40);
  local_250 = local_3b8;
  local_248 = 9;
  this = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
          *)local_3e7;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
               *)0x36a49b);
  __l_00._M_len = (size_type)in_stack_fffffffffffffb50;
  __l_00._M_array = in_stack_fffffffffffffb48;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  ::unordered_map(in_stack_fffffffffffffb40,__l_00,in_stack_fffffffffffffb38,
                  in_stack_fffffffffffffb30,(key_equal *)in_stack_fffffffffffffb28._M_cur,
                  in_stack_fffffffffffffb60);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>
                *)0x36a4e9);
  local_468 = (undefined1 **)&local_250;
  do {
    local_468 = local_468 + -5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>
             *)0x36a51a);
  } while (local_468 != local_3b8);
  local_3e8 = 0;
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::vector
            ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)0x36a546);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(local_10);
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::reserve
            ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)
             in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
  local_3f0 = local_10;
  local_3f8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffb20,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this), bVar1) {
    local_408 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_3f8);
    local_410._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
         ::find(this,(key_type *)0x36a5e7);
    local_418._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
         ::end(this);
    bVar1 = std::__detail::operator!=(&local_410,&local_418);
    if (bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_false,_true>
                    *)0x36a63b);
      std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::push_back
                ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)
                 in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28._M_cur);
    }
    else if ((local_11 & 1) != 0) {
      in_stack_fffffffffffffb28._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
           ::find(this,(key_type *)0x36a830);
      local_420._M_cur = in_stack_fffffffffffffb28._M_cur;
      local_410._M_cur = in_stack_fffffffffffffb28._M_cur;
      local_428._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
           ::end(this);
      bVar1 = std::__detail::operator!=(&local_410,&local_428);
      if (bVar1) {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>,_false,_true>
                      *)0x36a891);
        std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::push_back
                  ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)
                   in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28._M_cur);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3f8);
  }
  local_3e8 = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
                    *)0x36a8ed);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_sampler_type>_>_>
                    *)0x36a8fa);
  return in_RDI;
}

Assistant:

std::vector<common_sampler_type> common_sampler_types_from_names(const std::vector<std::string> & names, bool allow_alt_names) {
    std::unordered_map<std::string, common_sampler_type> sampler_canonical_name_map {
        { "dry",         COMMON_SAMPLER_TYPE_DRY },
        { "top_k",       COMMON_SAMPLER_TYPE_TOP_K },
        { "top_p",       COMMON_SAMPLER_TYPE_TOP_P },
        { "typ_p",       COMMON_SAMPLER_TYPE_TYPICAL_P },
        { "min_p",       COMMON_SAMPLER_TYPE_MIN_P },
        { "temperature", COMMON_SAMPLER_TYPE_TEMPERATURE },
        { "xtc",         COMMON_SAMPLER_TYPE_XTC },
        { "infill",      COMMON_SAMPLER_TYPE_INFILL },
        { "penalties",   COMMON_SAMPLER_TYPE_PENALTIES },
    };

    // since samplers names are written multiple ways
    // make it ready for both system names and input names
    std::unordered_map<std::string, common_sampler_type> sampler_alt_name_map {
        { "top-k",       COMMON_SAMPLER_TYPE_TOP_K },
        { "top-p",       COMMON_SAMPLER_TYPE_TOP_P },
        { "nucleus",     COMMON_SAMPLER_TYPE_TOP_P },
        { "typical-p",   COMMON_SAMPLER_TYPE_TYPICAL_P },
        { "typical",     COMMON_SAMPLER_TYPE_TYPICAL_P },
        { "typ-p",       COMMON_SAMPLER_TYPE_TYPICAL_P },
        { "typ",         COMMON_SAMPLER_TYPE_TYPICAL_P },
        { "min-p",       COMMON_SAMPLER_TYPE_MIN_P },
        { "temp",        COMMON_SAMPLER_TYPE_TEMPERATURE },
    };

    std::vector<common_sampler_type> samplers;
    samplers.reserve(names.size());

    for (const auto & name : names) {
        auto sampler = sampler_canonical_name_map.find(name);
        if (sampler != sampler_canonical_name_map.end()) {
            samplers.push_back(sampler->second);
        } else {
            if (allow_alt_names) {
                sampler = sampler_alt_name_map.find(name);
                if (sampler != sampler_alt_name_map.end()) {
                    samplers.push_back(sampler->second);
                }
            }
        }
    }

    return samplers;
}